

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_pedersen_blind_generator_blind_sum
              (secp256k1_context *ctx,uint64_t *value,uchar **generator_blind,
              uchar **blinding_factor,size_t n_total,size_t n_inputs)

{
  ulong uVar1;
  int overflow;
  int local_bc;
  uchar **local_b8;
  ulong local_b0;
  size_t local_a8;
  uint64_t *local_a0;
  secp256k1_scalar local_98;
  secp256k1_scalar local_78;
  secp256k1_scalar local_50;
  
  local_b8 = blinding_factor;
  local_a8 = n_inputs;
  local_a0 = value;
  if (value == (uint64_t *)0x0 && n_total != 0) {
    secp256k1_pedersen_blind_generator_blind_sum_cold_1();
  }
  else if (generator_blind == (uchar **)0x0 && n_total != 0) {
    secp256k1_pedersen_blind_generator_blind_sum_cold_2();
  }
  else if (blinding_factor == (uchar **)0x0 && n_total != 0) {
    secp256k1_pedersen_blind_generator_blind_sum_cold_3();
  }
  else if (n_inputs < n_total) {
    local_78.d[2] = 0;
    local_78.d[3] = 0;
    local_78.d[0] = 0;
    local_78.d[1] = 0;
    uVar1 = 0;
    local_b0 = n_total;
    while( true ) {
      local_bc = 0;
      local_98.d[0] = local_a0[uVar1];
      local_98.d[1] = 0;
      local_98.d[2] = 0;
      local_98.d[3] = 0;
      secp256k1_scalar_set_b32(&local_50,generator_blind[uVar1],&local_bc);
      if (local_bc == 1) break;
      secp256k1_scalar_mul(&local_98,&local_98,&local_50);
      secp256k1_scalar_set_b32(&local_50,local_b8[uVar1],&local_bc);
      if (local_bc == 1) {
        return 0;
      }
      secp256k1_scalar_add(&local_98,&local_98,&local_50);
      secp256k1_scalar_cond_negate(&local_98,(uint)(uVar1 < local_a8));
      secp256k1_scalar_add(&local_78,&local_78,&local_98);
      uVar1 = uVar1 + 1;
      if (local_b0 == uVar1) {
        secp256k1_scalar_negate(&local_78,&local_78);
        secp256k1_scalar_add(&local_50,&local_50,&local_78);
        secp256k1_scalar_get_b32(local_b8[local_b0 - 1],&local_50);
        return 1;
      }
    }
  }
  else {
    secp256k1_pedersen_blind_generator_blind_sum_cold_4();
  }
  return 0;
}

Assistant:

int secp256k1_pedersen_blind_generator_blind_sum(const secp256k1_context* ctx, const uint64_t *value, const unsigned char* const* generator_blind, unsigned char* const* blinding_factor, size_t n_total, size_t n_inputs) {
    secp256k1_scalar sum;
    secp256k1_scalar tmp;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(n_total == 0 || value != NULL);
    ARG_CHECK(n_total == 0 || generator_blind != NULL);
    ARG_CHECK(n_total == 0 || blinding_factor != NULL);
    ARG_CHECK(n_total > n_inputs);
    (void) ctx;

    if (n_total == 0) {
        return 1;
    }

    secp256k1_scalar_set_int(&sum, 0);
    for (i = 0; i < n_total; i++) {
        int overflow = 0;
        secp256k1_scalar addend;
        secp256k1_scalar_set_u64(&addend, value[i]);  /* s = v */

        secp256k1_scalar_set_b32(&tmp, generator_blind[i], &overflow);
        if (overflow == 1) {
            secp256k1_scalar_clear(&tmp);
            secp256k1_scalar_clear(&addend);
            secp256k1_scalar_clear(&sum);
            return 0;
        }
        secp256k1_scalar_mul(&addend, &addend, &tmp); /* s = vr */

        secp256k1_scalar_set_b32(&tmp, blinding_factor[i], &overflow);
        if (overflow == 1) {
            secp256k1_scalar_clear(&tmp);
            secp256k1_scalar_clear(&addend);
            secp256k1_scalar_clear(&sum);
            return 0;
        }
        secp256k1_scalar_add(&addend, &addend, &tmp); /* s = vr + r' */
        secp256k1_scalar_cond_negate(&addend, i < n_inputs);  /* s is negated if it's an input */
        secp256k1_scalar_add(&sum, &sum, &addend);    /* sum += s */
        secp256k1_scalar_clear(&addend);
    }

    /* Right now tmp has the last pedersen blinding factor. Subtract the sum from it. */
    secp256k1_scalar_negate(&sum, &sum);
    secp256k1_scalar_add(&tmp, &tmp, &sum);
    secp256k1_scalar_get_b32(blinding_factor[n_total - 1], &tmp);

    secp256k1_scalar_clear(&tmp);
    secp256k1_scalar_clear(&sum);
    return 1;
}